

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildArgExpList(CNscPStackEntry *pList,CNscPStackEntry *pArg)

{
  bool bVar1;
  NscType NVar2;
  CNscPStackEntry *in_RSI;
  CNscPStackEntry *in_RDI;
  CNscPStackEntry *unaff_retaddr;
  CNscPStackEntry *pOut;
  CNscPStackEntry *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  NscType in_stack_ffffffffffffffd4;
  CNscPStackEntry *local_20;
  undefined8 in_stack_fffffffffffffff8;
  NscType nType;
  
  nType = (NscType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  local_20 = in_RDI;
  if (in_RDI == (CNscPStackEntry *)0x0) {
    local_20 = CNscContext::GetPStackEntry
                         ((CNscContext *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (char *)in_stack_ffffffffffffffc8,0);
    CNscPStackEntry::SetType
              ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (NscType)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    NVar2 = CNscPStackEntry::GetType(local_20);
    if (NVar2 != NscType_Error) {
      NVar2 = CNscPStackEntry::GetType(in_RSI);
      if (NVar2 == NscType_Error) {
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (NscType)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      }
      else {
        in_stack_ffffffffffffffc8 = local_20;
        in_stack_ffffffffffffffd4 = CNscPStackEntry::GetType(in_RSI);
        CNscPStackEntry::GetData(in_RSI);
        CNscPStackEntry::GetDataSize(in_RSI);
        CNscPStackEntry::PushArgument(unaff_retaddr,nType,(uchar *)in_RDI,(size_t)in_RSI);
      }
    }
    CNscContext::FreePStackEntry
              ((CNscContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  else if (in_RSI != (CNscPStackEntry *)0x0) {
    CNscContext::FreePStackEntry
              ((CNscContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  return local_20;
}

Assistant:

YYSTYPE NscBuildArgExpList (YYSTYPE pList, YYSTYPE pArg)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pArg)
			g_pCtx ->FreePStackEntry (pArg);
		return pOut;
	}
	
	//
	// Process the argument
	//

	if (pOut ->GetType () != NscType_Error)
	{
		if (pArg ->GetType () != NscType_Error)
		{
			pOut ->PushArgument (pArg ->GetType (),
				pArg ->GetData (), pArg ->GetDataSize ());
		}
		else
			pOut ->SetType (NscType_Error);
	}
    g_pCtx ->FreePStackEntry (pArg);

	//
	// Return the new argument list
	//

	return pOut;
}